

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedPtr.hpp
# Opt level: O0

void __thiscall SharedPtr<r>::~SharedPtr(SharedPtr<r> *this)

{
  __int_type _Var1;
  int in_ECX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar2;
  void *in_RSI;
  char *in_R8;
  int in_R9D;
  r *this_00;
  SharedPtr<r> *this_local;
  
  if (this->pointersAmount != (atomic<unsigned_long> *)0x0) {
    std::__atomic_base<unsigned_long>::operator--
              (&this->pointersAmount->super___atomic_base<unsigned_long>);
    _Var1 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base *)this->pointersAmount);
    if (_Var1 == 0) {
      pvVar2 = extraout_RDX;
      if (this->pointersAmount != (atomic<unsigned_long> *)0x0) {
        in_RSI = (void *)0x8;
        operator_delete(this->pointersAmount,8);
        pvVar2 = extraout_RDX_00;
      }
      this_00 = this->data;
      if (this_00 != (r *)0x0) {
        SharedPtrTests_base_MemDestructor_Test::TestBody::r::~r
                  (this_00,in_RSI,pvVar2,in_ECX,in_R8,in_R9D,(int)this_00);
        operator_delete(this_00,8);
      }
    }
    this->pointersAmount = (atomic<unsigned_long> *)0x0;
    this->data = (r *)0x0;
  }
  return;
}

Assistant:

~SharedPtr() {
		if (pointersAmount == nullptr) return;
		--(*pointersAmount);
		if ((*pointersAmount) == 0) {
			delete pointersAmount;
			delete data;
		}
		pointersAmount = nullptr;
		data = nullptr;
	}